

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  char cVar1;
  pointer pcVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong in_RAX;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char cVar9;
  ulong uVar10;
  char buff [4];
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    uVar10 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar9 = (char)__return_storage_ptr__;
      if ((pcVar2[uVar10] == '%') && (uVar10 + 1 < uVar5)) {
        if (pcVar2[uVar10 + 1] == 'u') {
          if (uVar10 + 2 < uVar5) {
            lVar6 = 0;
            uVar4 = 0;
            do {
              cVar1 = pcVar2[lVar6 + uVar10 + 2];
              iVar7 = (int)cVar1;
              if (cVar1 == '\0') goto LAB_00138e21;
              uVar8 = iVar7 - 0x30;
              if (cVar1 < ' ' || 9 < uVar8) {
                if ((byte)(cVar1 + 0xbfU) < 6) {
                  uVar8 = iVar7 - 0x37;
                }
                else {
                  if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_00138e21;
                  uVar8 = iVar7 - 0x57;
                }
              }
              uVar4 = uVar4 * 0x10 + uVar8;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            uVar3 = (undefined1)uVar4;
            if ((int)uVar4 < 0x80) {
              uStack_38 = CONCAT35(uStack_38._5_3_,CONCAT14(uVar3,(undefined4)uStack_38)) &
                          0xffffff7fffffffff;
LAB_00138e96:
              std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&uStack_38 + 4);
            }
            else {
              if (uVar4 < 0x800) {
                uStack_38 = CONCAT26(uStack_38._6_2_,
                                     CONCAT15(uVar3,CONCAT14((char)(uVar4 >> 6),
                                                             (undefined4)uStack_38))) &
                            0xffff3fffffffffff | 0x80c000000000;
                goto LAB_00138e96;
              }
              if (uVar4 < 0xd800) {
LAB_00138e6e:
                uVar5 = CONCAT26(uStack_38._6_2_,
                                 CONCAT15((char)(uVar4 >> 6),
                                          CONCAT14((char)(uVar4 >> 0xc),(undefined4)uStack_38))) &
                        0xffff3fffffffffff;
                uStack_38._7_1_ = (undefined1)(uVar5 >> 0x38);
                uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16(uVar3,(int6)uVar5)) &
                            0xff3fffffffffffff | 0x8080e000000000;
                goto LAB_00138e96;
              }
              if (0xdfff < uVar4) {
                if (uVar4 < 0x10000) goto LAB_00138e6e;
                if (uVar4 < 0x110000) {
                  uStack_38 = CONCAT17(uVar3,CONCAT16((char)(uVar4 >> 6),
                                                      CONCAT15((char)(uVar4 >> 0xc),
                                                               CONCAT14((char)(uVar4 >> 0x12),
                                                                        (undefined4)uStack_38)))) &
                              0x3f3f3fffffffffff | 0x808080f000000000;
                  goto LAB_00138e96;
                }
              }
            }
            uVar10 = uVar10 + 5;
          }
          else {
LAB_00138e21:
            std::__cxx11::string::push_back(cVar9);
          }
        }
        else {
          lVar6 = 0;
          do {
            cVar1 = pcVar2[lVar6 + uVar10 + 1];
            if ((cVar1 == '\0') ||
               (((cVar1 < ' ' || 9 < (int)cVar1 - 0x30U && (5 < (byte)(cVar1 + 0xbfU))) &&
                (5 < (byte)(cVar1 + 0x9fU))))) {
              std::__cxx11::string::push_back(cVar9);
              goto LAB_00138da8;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 2);
          std::__cxx11::string::push_back(cVar9);
          uVar10 = uVar10 + 2;
        }
      }
      else {
        std::__cxx11::string::push_back(cVar9);
      }
LAB_00138da8:
      uVar10 = uVar10 + 1;
      uVar5 = s->_M_string_length;
    } while (uVar10 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}